

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  TestStatus *pTVar1;
  VkBufferUsageFlags VVar2;
  Unique<vk::Handle<(vk::HandleType)8>_> obj2;
  Unique<vk::Handle<(vk::HandleType)8>_> obj3;
  Unique<vk::Handle<(vk::HandleType)8>_> obj1;
  Unique<vk::Handle<(vk::HandleType)8>_> obj0;
  Environment env;
  Move<vk::Handle<(vk::HandleType)8>_> local_168;
  TestStatus *local_140;
  Move<vk::Handle<(vk::HandleType)8>_> local_138;
  VkBufferCreateInfo local_110;
  Move<vk::Handle<(vk::HandleType)8>_> local_d8;
  VkBuffer local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  undefined8 local_90;
  DeviceInterface *local_88;
  VkDevice local_80;
  deUint32 local_78 [2];
  undefined8 local_70;
  VkAllocationCallbacks *local_68;
  undefined4 local_60;
  Move<vk::Handle<(vk::HandleType)8>_> local_58;
  
  VVar2 = (VkBufferUsageFlags)params.size;
  local_90 = *(undefined8 *)(this + 8);
  local_140 = __return_storage_ptr__;
  local_88 = Context::getDeviceInterface((Context *)this);
  local_80 = Context::getDevice((Context *)this);
  local_78[0] = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_70 = *(undefined8 *)(this + 0x10);
  local_68 = (VkAllocationCallbacks *)0x0;
  local_60 = 4;
  local_110.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_110.queueFamilyIndexCount = 1;
  local_110.size = (VkDeviceSize)context;
  local_110.usage = VVar2;
  local_110.pQueueFamilyIndices = local_78;
  ::vk::createBuffer(&local_d8,local_88,local_80,&local_110,(VkAllocationCallbacks *)0x0);
  local_b8.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_b0.m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  DStack_b0.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_b0.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_110.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_110.queueFamilyIndexCount = 1;
  local_110.size = (VkDeviceSize)context;
  local_110.usage = VVar2;
  local_110.pQueueFamilyIndices = local_78;
  ::vk::createBuffer(&local_168,local_88,local_80,&local_110,local_68);
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_110.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_110.queueFamilyIndexCount = 1;
  local_110.size = (VkDeviceSize)context;
  local_110.usage = VVar2;
  local_110.pQueueFamilyIndices = local_78;
  ::vk::createBuffer(&local_138,local_88,local_80,&local_110,local_68);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_110.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_110.pNext = (void *)0x0;
  local_110.flags = 0;
  local_110.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_110.queueFamilyIndexCount = 1;
  local_110.size = (VkDeviceSize)context;
  local_110.usage = VVar2;
  local_110.pQueueFamilyIndices = local_78;
  ::vk::createBuffer(&local_58,local_88,local_80,&local_110,local_68);
  pTVar1 = local_140;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  if (local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_138.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_b0,local_b8);
  }
  local_110._0_8_ = (void *)((long)&local_110 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Ok","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_110._0_8_,
             (long)local_110.pNext + local_110._0_8_);
  if ((void *)local_110._0_8_ != (void *)((long)&local_110 + 0x10U)) {
    operator_delete((void *)local_110._0_8_,CONCAT44(local_110._20_4_,local_110.flags) + 1);
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}